

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

int pulse_get_preferred_sample_rate(cubeb_conflict *ctx,uint32_t *rate)

{
  if ((ctx != (cubeb_conflict *)0x0) && (rate != (uint32_t *)0x0)) {
    if (ctx->default_sink_info != (cubeb_default_sink_info *)0x0) {
      *rate = ctx->default_sink_info->sample_spec_rate;
      return 0;
    }
    return -1;
  }
  __assert_fail("ctx && rate",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                ,0x2e8,"int pulse_get_preferred_sample_rate(cubeb *, uint32_t *)");
}

Assistant:

static int
pulse_get_preferred_sample_rate(cubeb * ctx, uint32_t * rate)
{
  assert(ctx && rate);
  (void)ctx;

  if (!ctx->default_sink_info)
    return CUBEB_ERROR;

  *rate = ctx->default_sink_info->sample_spec_rate;

  return CUBEB_OK;
}